

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O2

int __thiscall AudioFileWriter::close(AudioFileWriter *this,int __fd)

{
  int iVar1;
  uchar headerBuffer [44];
  
  if (this->waveMode == true) {
    iVar1 = QFile::size();
    builtin_memcpy(headerBuffer + 8,"WAVEfmt \x10",10);
    headerBuffer[0x20] = '\x04';
    headerBuffer[0x21] = '\0';
    headerBuffer[0x22] = '\x10';
    headerBuffer[0x23] = '\0';
    headerBuffer[0x12] = '\0';
    headerBuffer[0x13] = '\0';
    headerBuffer[0x14] = '\x01';
    headerBuffer[0x15] = '\0';
    headerBuffer[0x16] = '\x02';
    headerBuffer[0x17] = '\0';
    headerBuffer._4_4_ = iVar1 + -8;
    builtin_memcpy(headerBuffer,"RIFF",4);
    headerBuffer._40_4_ = iVar1 + -0x2c;
    headerBuffer[0x24] = 'd';
    headerBuffer[0x25] = 'a';
    headerBuffer[0x26] = 't';
    headerBuffer[0x27] = 'a';
    headerBuffer._24_4_ = this->sampleRate;
    headerBuffer._28_4_ = headerBuffer._24_4_ << 2;
    QFileDevice::seek((longlong)&this->file);
    QIODevice::write((char *)&this->file,(longlong)headerBuffer);
  }
  iVar1 = QFileDevice::close();
  return iVar1;
}

Assistant:

void AudioFileWriter::close() {
	if (waveMode) {
		uchar headerBuffer[WAVE_HEADER_LENGTH];
		quint32 fileSize = (quint32)file.size();
		memcpy(headerBuffer, WAVE_HEADER, WAVE_HEADER_LENGTH);
		qToLittleEndian(fileSize - RIFF_HEADER_LENGTH, headerBuffer + RIFF_PAYLOAD_SIZE_OFFSET);
		qToLittleEndian(fileSize - WAVE_HEADER_LENGTH, headerBuffer + WAVE_DATA_SIZE_OFFSET);
		qToLittleEndian(sampleRate, headerBuffer + WAVE_SAMPLE_RATE_OFFSET);
		qToLittleEndian(sampleRate * FRAME_SIZE, headerBuffer + WAVE_BYTE_RATE_OFFSET);
		file.seek(0);
		file.write((char *)headerBuffer, WAVE_HEADER_LENGTH);
	}
	file.close();
}